

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

int fp_unpack_hdu(fitsfile *infptr,int *outfptr,int *param_3)

{
  int iVar1;
  int local_30;
  int local_2c;
  int lval;
  int hdutype;
  int *status_local;
  fitsfile *outfptr_local;
  fitsfile *infptr_local;
  
  if (*param_3 < 1) {
    _lval = param_3;
    status_local = outfptr;
    outfptr_local = infptr;
    ffghdt(infptr,&local_2c,param_3);
    if (local_2c == 2) {
      ffgky(outfptr_local,0xe,"ZTABLE",&local_30,0,_lval);
      if ((*_lval == 0) && (local_30 != 0)) {
        fits_uncompress_table(outfptr_local,status_local,_lval);
      }
      else {
        if (*_lval == 0xca) {
          *_lval = 0;
        }
        ffcopy(outfptr_local,status_local,0,_lval);
      }
    }
    else {
      iVar1 = fits_is_compressed_image(outfptr_local,_lval);
      if (iVar1 == 0) {
        ffcopy(outfptr_local,status_local,0,_lval);
      }
      else {
        fits_img_decompress(outfptr_local,status_local,_lval);
      }
    }
  }
  return 0;
}

Assistant:

int fp_unpack_hdu (fitsfile *infptr, fitsfile *outfptr, fpstate fpvar, int *status)
{
	int hdutype, lval;

        if (*status > 0) return(0);

	fits_get_hdu_type (infptr, &hdutype, status);

        /* =============================================================== */
        /* This block is only for beta testing of binary table compression */
	if (hdutype == BINARY_TBL) { 

	    fits_read_key(infptr, TLOGICAL, "ZTABLE", &lval, NULL, status);
	    
	    if (*status == 0 && lval != 0) {
	        /*  uncompress the table */
	        fits_uncompress_table (infptr, outfptr, status);
	    } else {
	        if (*status == KEY_NO_EXIST)  /* table is not compressed */
		    *status = 0;
                fits_copy_hdu (infptr, outfptr, 0, status);
            }

	    return(0);
        /* =============================================================== */

	} else if (fits_is_compressed_image (infptr,  status)) {
            /* uncompress the compressed image HDU */
            fits_img_decompress (infptr, outfptr, status);
        } else {
            /* not a compressed image HDU, so just copy it to the output */
            fits_copy_hdu (infptr, outfptr, 0, status);
        }

	return(0);
}